

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

token * collect_arg(dmr_C *C,token *prev,int vararg,position *pos,int count)

{
  stream *psVar1;
  position pVar2;
  int iVar3;
  uint uVar4;
  token *token;
  bool bVar5;
  int local_54;
  int nesting;
  token *next;
  token **p;
  stream *stream;
  int count_local;
  position *pos_local;
  int vararg_local;
  token *prev_local;
  dmr_C *C_local;
  
  psVar1 = C->T->input_streams;
  pVar2 = prev->pos;
  next = (token *)&prev->next;
  local_54 = 0;
  while (token = scan_next(C,(token **)next), token != &dmrC_eof_token_entry_) {
    if (((((ulong)token->pos >> 0x14 & 1) == 0) || (iVar3 = dmrC_match_op(token,0x23), iVar3 == 0))
       || ((long)token->pos < 0)) {
      uVar4 = *(uint *)&token->pos & 0x3f;
      if (uVar4 - 0xf < 2) {
        if (1 < count) {
          *(token->field_2).string =
               (string)((uint)*(token->field_2).string & 0x7fffffff | 0x80000000);
        }
      }
      else if (uVar4 == 0x12 || uVar4 == 0x13) {
        next->pos = (position)&dmrC_eof_token_entry_;
        return token;
      }
      if (C->false_nesting == 0) {
        iVar3 = dmrC_match_op(token,0x28);
        if (iVar3 == 0) {
          iVar3 = dmrC_match_op(token,0x29);
          if (iVar3 == 0) {
            iVar3 = dmrC_match_op(token,0x2c);
            if (((iVar3 != 0) && (local_54 == 0)) && (vararg == 0)) break;
          }
          else {
            bVar5 = local_54 == 0;
            local_54 = local_54 + -1;
            if (bVar5) break;
          }
        }
        else {
          local_54 = local_54 + 1;
        }
        token->pos = (position)
                     ((ulong)token->pos & 0xfffffffffff0003f |
                     (ulong)((uint)((ulong)*pos >> 6) & 0x3fff) << 6);
        token->pos = (position)
                     ((ulong)token->pos & 0x80000000ffffffff |
                     (ulong)(SUB84(*pos,4) & 0x7fffffff) << 0x20);
        token->pos = (position)
                     ((ulong)token->pos & 0xffffffff003fffff |
                     (ulong)((uint)((ulong)*pos >> 0x16) & 0x3ff) << 0x16);
        next = (token *)&token->next;
      }
      else {
        next->pos = (position)token->next;
        dmrC_allocator_free(&C->token_allocator,token);
      }
    }
    else {
      dmrC_sparse_error(C,token->pos,"directive in argument list");
      preprocessor_line(C,psVar1 + (int)((uint)((ulong)pVar2 >> 6) & 0x3fff),(token **)next);
      dmrC_allocator_free(&C->token_allocator,token);
    }
  }
  next->pos = (position)&dmrC_eof_token_entry_;
  return token;
}

Assistant:

static struct token *collect_arg(struct dmr_C *C, struct token *prev, int vararg, struct position *pos, int count)
{
	struct stream *stream = C->T->input_streams + prev->pos.stream;
	struct token **p = &prev->next;
	struct token *next;
	int nesting = 0;

	while (!dmrC_eof_token(next = scan_next(C, p))) {
		if (next->pos.newline && dmrC_match_op(next, '#')) {
			if (!next->pos.noexpand) {
				dmrC_sparse_error(C, next->pos,
					     "directive in argument list");
				preprocessor_line(C, stream, p);
				dmrC_allocator_free(&C->token_allocator, next);	/* Free the '#' token */
				continue;
			}
		}
		switch (dmrC_token_type(next)) {
		case TOKEN_STREAMEND:
		case TOKEN_STREAMBEGIN:
			*p = &dmrC_eof_token_entry_;
			return next;
		case TOKEN_STRING:
		case TOKEN_WIDE_STRING:
			if (count > 1)
				next->string->immutable = 1;
			break;
		}
		if (C->false_nesting) {
			*p = next->next;
			dmrC_allocator_free(&C->token_allocator, next);
			continue;
		}
		if (dmrC_match_op(next, '(')) {
			nesting++;
		} else if (dmrC_match_op(next, ')')) {
			if (!nesting--)
				break;
		} else if (dmrC_match_op(next, ',') && !nesting && !vararg) {
			break;
		}
		next->pos.stream = pos->stream;
		next->pos.line = pos->line;
		next->pos.pos = pos->pos;
		p = &next->next;
	}
	*p = &dmrC_eof_token_entry_;
	return next;
}